

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Synth.cpp
# Opt level: O3

void __thiscall MT32Emu::MidiEventQueue::~MidiEventQueue(MidiEventQueue *this)

{
  Bit32u i;
  uint uVar1;
  ulong uVar2;
  
  uVar2 = 0;
  do {
    (*this->sysexDataStorage->_vptr_SysexDataStorage[4])
              (this->sysexDataStorage,this->ringBuffer[uVar2].sysexData,
               (ulong)this->ringBuffer[uVar2].field_1.sysexLength);
    uVar1 = (int)uVar2 + 1;
    uVar2 = (ulong)uVar1;
  } while (uVar1 <= this->ringBufferMask);
  if (this->sysexDataStorage != (SysexDataStorage *)0x0) {
    (*this->sysexDataStorage->_vptr_SysexDataStorage[1])();
  }
  if (this->ringBuffer != (MidiEvent *)0x0) {
    operator_delete__(this->ringBuffer);
    return;
  }
  return;
}

Assistant:

MidiEventQueue::~MidiEventQueue() {
	for (Bit32u i = 0; i <= ringBufferMask; i++) {
		volatile MidiEvent &currentEvent = ringBuffer[i];
		sysexDataStorage.dispose(currentEvent.sysexData, currentEvent.sysexLength);
	}
	delete &sysexDataStorage;
	delete[] ringBuffer;
}